

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall Rml::ElementDocument::UpdatePosition(ElementDocument *this)

{
  Element *this_00;
  Element *pEVar1;
  Box *this_01;
  ComputedValues *this_02;
  LengthPercentageAuto LVar2;
  float fVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  float fStack_7c;
  Type local_78;
  Type local_68;
  float local_58;
  Type local_50;
  Type local_40;
  Vector2<float> local_38;
  Vector2f position;
  Box *box;
  ComputedValues *computed;
  Vector2f containing_block;
  Element *root;
  ElementDocument *this_local;
  
  if ((this->position_dirty & 1U) != 0) {
    this->position_dirty = false;
    this_00 = Element::GetParentNode(&this->super_Element);
    if (((this_00 != (Element *)0x0) && (this->context != (Context *)0x0)) &&
       (pEVar1 = Context::GetRootElement(this->context), this_00 == pEVar1)) {
      this_01 = Element::GetBox(this_00);
      VVar4 = Box::GetSize(this_01);
      this_02 = Element::GetComputedValues(&this->super_Element);
      position = (Vector2f)Element::GetBox(&this->super_Element);
      Vector2<float>::Vector2(&local_38);
      LVar2 = Style::ComputedValues::left(this_02);
      local_40 = LVar2.type;
      computed._0_4_ = VVar4.x;
      if (local_40 == Auto) {
        LVar2 = Style::ComputedValues::right(this_02);
        local_50 = LVar2.type;
        if (local_50 != Auto) {
          VVar5 = Box::GetSize((Box *)position,Margin);
          local_58 = VVar5.x;
          LVar2 = Style::ComputedValues::right(this_02);
          fVar3 = ResolveValue(LVar2,computed._0_4_);
          local_38.x = computed._0_4_ - (local_58 + fVar3);
        }
      }
      else {
        LVar2 = Style::ComputedValues::left(this_02);
        local_38.x = ResolveValue(LVar2,computed._0_4_);
      }
      LVar2 = Style::ComputedValues::top(this_02);
      local_68 = LVar2.type;
      computed._4_4_ = VVar4.y;
      if (local_68 == Auto) {
        LVar2 = Style::ComputedValues::bottom(this_02);
        local_78 = LVar2.type;
        if (local_78 != Auto) {
          VVar4 = Box::GetSize((Box *)position,Margin);
          fStack_7c = VVar4.y;
          LVar2 = Style::ComputedValues::bottom(this_02);
          fVar3 = ResolveValue(LVar2,computed._4_4_);
          local_38.y = computed._4_4_ - (fStack_7c + fVar3);
        }
      }
      else {
        LVar2 = Style::ComputedValues::top(this_02);
        local_38.y = ResolveValue(LVar2,computed._4_4_);
      }
      fVar3 = Box::GetEdge((Box *)position,Margin,Left);
      local_38.x = local_38.x + fVar3;
      fVar3 = Box::GetEdge((Box *)position,Margin,Top);
      local_38.y = local_38.y + fVar3;
      VVar4.y = local_38.y;
      VVar4.x = local_38.x;
      Element::SetOffset(&this->super_Element,VVar4,(Element *)0x0,false);
    }
  }
  return;
}

Assistant:

void ElementDocument::UpdatePosition()
{
	if (position_dirty)
	{
		RMLUI_ZoneScoped;

		position_dirty = false;

		Element* root = GetParentNode();

		// We only position ourselves if we are a child of our context's root element. That is, we don't want to proceed
		// if we are unparented or an iframe document.
		if (!root || !context || (root != context->GetRootElement()))
			return;

		// Work out our containing block; relative offsets are calculated against it.
		const Vector2f containing_block = root->GetBox().GetSize();
		auto& computed = GetComputedValues();
		const Box& box = GetBox();

		Vector2f position;

		if (computed.left().type != Style::Left::Auto)
			position.x = ResolveValue(computed.left(), containing_block.x);
		else if (computed.right().type != Style::Right::Auto)
			position.x = containing_block.x - (box.GetSize(BoxArea::Margin).x + ResolveValue(computed.right(), containing_block.x));

		if (computed.top().type != Style::Top::Auto)
			position.y = ResolveValue(computed.top(), containing_block.y);
		else if (computed.bottom().type != Style::Bottom::Auto)
			position.y = containing_block.y - (box.GetSize(BoxArea::Margin).y + ResolveValue(computed.bottom(), containing_block.y));

		// Add the margin edge to the position, since inset properties (top/right/bottom/left) set the margin edge
		// position, while offsets use the border edge.
		position.x += box.GetEdge(BoxArea::Margin, BoxEdge::Left);
		position.y += box.GetEdge(BoxArea::Margin, BoxEdge::Top);

		SetOffset(position, nullptr);
	}
}